

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void TestDacRW(BasePort *port,uchar boardNum)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  nodeaddr_t addr;
  long lVar9;
  bool bVar10;
  undefined8 local_60;
  quadlet_t write_block [6];
  
  uVar8 = (ulong)boardNum;
  if (boardNum < 0x10) {
    local_60 = port->FirmwareVersion[uVar8];
  }
  else {
    local_60 = 0;
  }
  uVar4 = (ulong)(7 < local_60);
  lVar7 = 1;
  lVar5 = 0;
  for (lVar9 = 0x11; lVar9 != 0x51; lVar9 = lVar9 + 0x10) {
    write_block[uVar4 + lVar7 + -1] = 0;
    iVar1 = (*port->_vptr_BasePort[0x23])(port,uVar8,lVar9,(long)write_block + lVar5 + uVar4 * 4);
    if ((char)iVar1 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed to read quadlet for channel ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    write_block[uVar4 + lVar7 + -1] = (uint)(ushort)write_block[uVar4 + lVar7 + -1];
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 4;
  }
  bVar10 = 7 < local_60;
  poVar3 = std::operator<<((ostream *)&std::cout,"Read from DAC: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (7 < local_60) {
    write_block[0] = (uint)boardNum << 0x10 | 0x6000000;
  }
  lVar9 = 0;
  uVar2 = (uint)boardNum << 0x18;
  if (7 < local_60) {
    uVar2 = 0;
  }
  iVar1 = 0x100;
  for (; lVar9 != 4; lVar9 = lVar9 + 1) {
    uVar6 = write_block[uVar4 + lVar9] + iVar1;
    write_block[uVar4 + lVar9] =
         (uVar6 | 0x80000000) >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
         write_block[uVar4 + lVar9] * 0x1000000 | uVar2;
    iVar1 = iVar1 + 0x100;
  }
  uVar4 = (ulong)((bVar10 + 5) * 4);
  *(undefined4 *)((uVar4 - 4) + (long)write_block) = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Setting new values");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = (*port->_vptr_BasePort[0x27])(port,uVar8,0,write_block,uVar4);
  if ((char)iVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to write block data");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void TestDacRW(BasePort *port, unsigned char boardNum)
{
    size_t i;
    quadlet_t write_block[6];

    size_t i0 = 0;
    size_t numQuads = 5;
    unsigned long fver = port->GetFirmwareVersion(boardNum);
    if (fver > 7) {
        i0 = 1;
        numQuads = 6;
    }

    // Read from DAC (quadlet reads), modify values, write them using
    // a block write.
    for (i = 0; i < 4; i++) {
        nodeaddr_t addr = 0x0001 | ((i+1) << 4);  // channel 1-4, DAC Control
        write_block[i0+i] = 0;
        if (!port->ReadQuadlet(boardNum, addr, write_block[i0+i]))
            std::cout << "Failed to read quadlet for channel " << (i+1) << std::endl;
        write_block[i0+i] &= 0x0000ffff;
    }
    std::cout << "Read from DAC: " << std::hex << write_block[i0+0] << ", "
              << write_block[i0+1] << ", " << write_block[i0+2] << ", "
              << write_block[i0+3] << std::endl;
    if (fver > 7) {
        write_block[0] = bswap_32(static_cast<quadlet_t>((boardNum << 8) | numQuads));
    }
    for (i = 0; i < 4; i++) {
        write_block[i0+i] = bswap_32(VALID_BIT | (write_block[i0+i]+static_cast<quadlet_t>(i+1)*0x100));
        if (fver < 8)
            write_block[i0+i] |= (boardNum<<24);
    }
    write_block[numQuads-1] = 0;   // power control
    std::cout << "Setting new values" << std::endl;
    if (!port->WriteBlock(boardNum, 0, write_block, numQuads*sizeof(quadlet_t)))
        std::cout << "Failed to write block data" << std::endl;
}